

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeR.cpp
# Opt level: O0

void __thiscall
OpenMD::ChargeR::ChargeR
          (ChargeR *this,SimInfo *info,string *filename,string *sele,RealType len,int nrbins)

{
  undefined1 uVar1;
  ostream *this_00;
  StaticAnalyser *this_01;
  string *psVar2;
  string *in_RCX;
  SimInfo *in_RDX;
  SimInfo *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffd38;
  StaticAnalyser *in_stack_fffffffffffffd40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffd48;
  StaticAnalyser *in_stack_fffffffffffffd50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  undefined8 *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  SelectionEvaluator *this_02;
  SelectionEvaluator *this_03;
  string local_258 [32];
  stringstream local_238 [16];
  ostream local_228 [96];
  SimInfo *in_stack_fffffffffffffe38;
  SelectionEvaluator *in_stack_fffffffffffffe40;
  string local_b0 [32];
  string local_90 [36];
  undefined4 local_6c;
  double *local_68;
  double *local_60;
  undefined8 local_28;
  string *local_20;
  
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffd50,(SimInfo *)in_stack_fffffffffffffd48._M_current,
             (string *)in_stack_fffffffffffffd40,(uint)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  *in_RDI = &PTR__ChargeR_00560810;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),local_20);
  this_03 = (SelectionEvaluator *)(in_RDI + 0x1f);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  psVar2 = (string *)(in_RDI + 0xc9);
  SelectionManager::SelectionManager((SelectionManager *)in_RSI,in_RDX);
  Thermo::Thermo((Thermo *)(in_RDI + 0xe2),in_RSI);
  in_RDI[0xe3] = local_28;
  std::
  vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
  ::vector((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
            *)0x1fcded);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1fce03);
  this_02 = (SelectionEvaluator *)(in_RDI + 0xeb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1fce19);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1fce2f);
  SelectionEvaluator::loadScriptString(this_03,psVar2);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    in_stack_fffffffffffffd58 = in_RDI + 0xc9;
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffd50,
               (SelectionSet *)in_stack_fffffffffffffd48._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x1fceb9);
  }
  in_RDI[0xe4] = (double)in_RDI[0xe3] / (double)*(uint *)((long)in_RDI + 0x34);
  std::
  vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
  ::resize((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
            *)CONCAT17(uVar1,in_stack_fffffffffffffd60),(size_type)in_stack_fffffffffffffd58);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  __first._M_current = (double *)(in_RDI + 0xe8);
  local_60 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd38);
  local_68 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd38);
  local_6c = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (__first,in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd40);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  getPrefix((string *)in_stack_fffffffffffffd48._M_current);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd48._M_current,(char *)in_stack_fffffffffffffd40);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::stringstream::stringstream(local_238);
  this_00 = std::operator<<(local_228," len = ");
  this_01 = (StaticAnalyser *)std::ostream::operator<<(this_00,(double)in_RDI[0xe3]);
  psVar2 = (string *)std::operator<<((ostream *)this_01,", nrbins = ");
  std::ostream::operator<<(psVar2,*(uint *)((long)in_RDI + 0x34));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_01,psVar2);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::stringstream::~stringstream(local_238);
  return;
}

Assistant:

ChargeR::ChargeR(SimInfo* info, const std::string& filename,
                   const std::string& sele, RealType len, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), thermo_(info),
      len_(len) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    deltaR_ = len_ / nBins_;

    // fixed number of bins

    sliceSDLists_.resize(nBins_);
    sliceSDCount_.resize(nBins_);
    std::fill(sliceSDCount_.begin(), sliceSDCount_.end(), 0);

    chargeR_.resize(nBins_);
    setOutputName(getPrefix(filename) + ".ChargeR");
    std::stringstream params;
    params << " len = " << len_ << ", nrbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }